

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O1

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::
_dtFromPseudoVarWithIntRangesType<yactfr::VariantWithUnsignedIntegerSelectorType,unsigned_long_long>
          (DtFromPseudoRootDtConverter *this,PseudoVarWithIntRangesType *pseudoVarType,
          DataLocation *selLoc)

{
  long lVar1;
  pointer pcVar2;
  _Head_base<0UL,_const_yactfr::DataType_*,_false> _Var3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  size_t *psVar6;
  DataLocation *in_RCX;
  pointer *__ptr;
  ulong uVar7;
  Options opts;
  undefined1 local_128 [8];
  undefined1 local_120 [16];
  undefined1 local_110 [32];
  _Base_ptr p_Stack_f0;
  __node_base local_e8;
  pointer local_e0;
  _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
  local_d8;
  vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  local_a8;
  _Head_base<0UL,_const_yactfr::DataType_*,_false> local_88;
  DataLocation *local_80;
  DataLocation *local_78;
  _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_70;
  IntegerRange<unsigned_long_long,_true> local_60 [3];
  
  local_a8.
  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120._8_8_ = pseudoVarType;
  local_88._M_head_impl = (DataType *)this;
  local_80 = in_RCX;
  if (*(pointer *)(selLoc + 2) !=
      selLoc[1]._pathElems.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_70 = (_Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&(pseudoVarType->super_PseudoVarType).super_PseudoDt._posInScope.super_type.
                   m_storage;
    uVar7 = 0;
    local_78 = selLoc;
    do {
      local_110._0_8_ = selLoc;
      pmVar4 = std::__detail::
               _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_70,(key_type *)local_110);
      *pmVar4 = uVar7;
      local_e0 = selLoc[1]._pathElems.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_110._8_4_ = 0;
      local_110._16_8_ = (PseudoErt *)0x0;
      local_110._24_8_ = local_110 + 8;
      local_e8._M_nxt = (_Hash_node_base *)0x0;
      lVar1 = *(long *)(selLoc + 6) + uVar7 * 0x30;
      p_Stack_f0 = (_Base_ptr)local_110._24_8_;
      for (p_Var5 = *(_Rb_tree_node_base **)(lVar1 + 0x18);
          p_Var5 != (_Rb_tree_node_base *)(lVar1 + 8);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        local_60[0]._lower = *(unsigned_long_long *)(p_Var5 + 1);
        local_60[0]._upper = (unsigned_long_long)p_Var5[1]._M_parent;
        if (local_60[0]._upper < local_60[0]._lower) {
          __assert_fail("lower <= upper",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/include/yactfr/metadata/int-range.hpp"
                        ,0x38,
                        "yactfr::IntegerRange<unsigned long long>::IntegerRange(const ValueT, const ValueT) [ValueT = unsigned long long, ValidatePreconditionsV = true]"
                       );
        }
        std::
        _Rb_tree<yactfr::IntegerRange<unsigned_long_long,true>,yactfr::IntegerRange<unsigned_long_long,true>,std::_Identity<yactfr::IntegerRange<unsigned_long_long,true>>,std::less<yactfr::IntegerRange<unsigned_long_long,true>>,std::allocator<yactfr::IntegerRange<unsigned_long_long,true>>>
        ::_M_insert_unique<yactfr::IntegerRange<unsigned_long_long,true>>
                  ((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,true>,yactfr::IntegerRange<unsigned_long_long,true>,std::_Identity<yactfr::IntegerRange<unsigned_long_long,true>>,std::less<yactfr::IntegerRange<unsigned_long_long,true>>,std::allocator<yactfr::IntegerRange<unsigned_long_long,true>>>
                    *)local_110,local_60);
      }
      pcVar2 = (&local_e0->_M_dataplus)[uVar7]._M_p;
      _dtFromPseudoDt((DtFromPseudoRootDtConverter *)local_120,(PseudoDt *)local_120._8_8_);
      if ((PseudoErt *)local_110._16_8_ == (PseudoErt *)0x0) {
        local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_d8._M_impl.super__Rb_tree_header._M_header;
        psVar6 = &local_d8._M_impl.super__Rb_tree_header._M_node_count;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      else {
        local_d8._M_impl.super__Rb_tree_header._M_header._M_color = local_110._8_4_;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_110._16_8_;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_110._24_8_;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_f0;
        *(_Rb_tree_header **)&((Item *)local_110._16_8_)->super_ItemMixin<yactfr::ItemKind> =
             &local_d8._M_impl.super__Rb_tree_header;
        local_d8._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_e8._M_nxt;
        local_110._16_8_ =
             (__uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>)
             0x0;
        local_110._24_8_ = local_110 + 8;
        psVar6 = (size_t *)&local_e8;
        p_Stack_f0 = (_Base_ptr)local_110._24_8_;
      }
      *psVar6 = 0;
      std::
      _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
      ::_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                  *)local_60,&local_d8);
      _tryCloneAttrs((MapItem *)&stack0xffffffffffffff98);
      std::
      make_unique<yactfr::VariantTypeOption<unsigned_long_long>const,boost::optional<std::__cxx11::string>const&,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_128,
                 (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *
                 )(pcVar2 + 8),(IntegerRangeSet<unsigned_long_long,_true> *)local_120,
                 (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                 local_60);
      std::
      vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>
      ::
      emplace_back<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>
                ((vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>
                  *)&local_a8,
                 (unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                  *)local_128);
      selLoc = local_78;
      if (local_128 != (undefined1  [8])0x0) {
        std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>::operator()
                  ((default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_> *)local_128
                   ,(VariantTypeOption<unsigned_long_long> *)local_128);
      }
      local_128 = (undefined1  [8])0x0;
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  &stack0xffffffffffffff98);
      std::
      _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
      ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                   *)local_60);
      std::
      _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
      ::~_Rb_tree(&local_d8);
      if ((type)local_120._0_8_ != (type)0x0) {
        (**(code **)(*(long *)local_120._0_8_ + 8))();
      }
      std::
      _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
      ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                   *)local_110);
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar7 < (ulong)(*(long *)(selLoc + 2) -
                             (long)selLoc[1]._pathElems.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3));
  }
  local_110._0_8_ = selLoc;
  std::
  _Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(local_120._8_8_ + 0x28));
  local_128._0_4_ = 1;
  _tryCloneAttrs((MapItem *)local_60);
  VariantWithUnsignedIntegerSelectorType::
  create<int,std::vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>,yactfr::DataLocation,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((VariantWithUnsignedIntegerSelectorType *)local_110,(int *)local_128,&local_a8,local_80
             ,(unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
              local_60);
  _Var3._M_head_impl = local_88._M_head_impl;
  (local_88._M_head_impl)->_vptr_DataType = (_func_int **)local_110._0_8_;
  local_110._0_8_ = 0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_60);
  std::
  vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ::~vector(&local_a8);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )_Var3._M_head_impl;
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoVarWithIntRangesType(const PseudoVarWithIntRangesType& pseudoVarType,
                                                                            DataLocation&& selLoc)
{
    typename VarTypeT::Options opts;

    for (auto i = 0U; i < pseudoVarType.pseudoOpts().size(); ++i) {
        // currently being visited
        _current[&pseudoVarType] = i;

        const auto& pseudoOpt = pseudoVarType.pseudoOpts()[i];
        std::set<IntegerRange<IntRangeValueT>> ranges;

        for (auto& range : pseudoVarType.rangeSets()[i]) {
            ranges.insert(IntegerRange<IntRangeValueT> {
                static_cast<IntRangeValueT>(range.lower()),
                static_cast<IntRangeValueT>(range.upper())
            });
        }

        opts.push_back(VarTypeT::Option::create(pseudoOpt->name(),
                                                this->_dtFromPseudoDt(pseudoOpt->pseudoDt()),
                                                IntegerRangeSet<IntRangeValueT> {std::move(ranges)},
                                                this->_tryCloneAttrs(pseudoOpt->attrs())));
    }

    // not visited anymore
    _current.erase(&pseudoVarType);

    return VarTypeT::create(1, std::move(opts), std::move(selLoc),
                            this->_tryCloneAttrs(pseudoVarType.attrs()));
}